

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyTable.c
# Opt level: O0

int * Ivy_TableFind(Ivy_Man_t *p,Ivy_Obj_t *pObj)

{
  int iVar1;
  uint local_1c;
  int i;
  Ivy_Obj_t *pObj_local;
  Ivy_Man_t *p_local;
  
  iVar1 = Ivy_ObjIsHash(pObj);
  if (iVar1 != 0) {
    for (local_1c = Ivy_Hash(pObj,p->nTableSize);
        (p->pTable[(int)local_1c] != 0 && (p->pTable[(int)local_1c] != pObj->Id));
        local_1c = (int)(local_1c + 1) % p->nTableSize) {
    }
    return p->pTable + (int)local_1c;
  }
  __assert_fail("Ivy_ObjIsHash(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyTable.c"
                ,0x2e,"int *Ivy_TableFind(Ivy_Man_t *, Ivy_Obj_t *)");
}

Assistant:

static int * Ivy_TableFind( Ivy_Man_t * p, Ivy_Obj_t * pObj )
{
    int i;
    assert( Ivy_ObjIsHash(pObj) );
    for ( i = Ivy_Hash(pObj, p->nTableSize); p->pTable[i]; i = (i+1) % p->nTableSize )
        if ( p->pTable[i] == pObj->Id )
            break;
    return p->pTable + i;
}